

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O2

int __thiscall cali::ConfigSetImpl::init(ConfigSetImpl *this,EVP_PKEY_CTX *ctx)

{
  const_iterator cVar1;
  char *pcVar2;
  _Rb_tree_header *p_Var3;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  string value;
  string varname;
  allocator<char> local_10d;
  undefined4 local_10c;
  EVP_PKEY_CTX *local_108;
  _Base_ptr local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_f0;
  _Base_ptr local_e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string local_d0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
  local_b0;
  string local_70 [32];
  string local_50;
  
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX[1];
  local_e8 = &(in_R9->_M_impl).super__Rb_tree_header._M_header;
  p_Var3 = &(in_R8->_M_impl).super__Rb_tree_header;
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDX;
  local_10c = in_ECX;
  local_108 = ctx;
  local_100 = &p_Var3->_M_header;
  local_f8 = in_R8;
  local_f0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this;
  local_e0 = in_R9;
  for (; key != local_d8; key = key + 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,(char *)local_108,(allocator<char> *)local_70);
    anon_unknown.dwarf_2ef27::config_var_name(&local_50,&local_b0.first,key);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string(local_70,(string *)(key + 1));
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_e0,&local_50);
    if (cVar1._M_node == local_e8) {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_f8,&local_50);
      if (cVar1._M_node != local_100) {
        std::__cxx11::string::_M_assign(local_70);
      }
      if ((char)local_10c != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,(char *)local_108,&local_10d);
        anon_unknown.dwarf_2ef27::config_var_name(&local_b0.first,&local_d0,key);
        pcVar2 = getenv(local_b0.first._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::assign((char *)local_70);
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign(local_70);
    }
    std::__cxx11::string::string((string *)&local_d0,local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
    ::pair<cali::StringConverter,_true>(&local_b0,key,(StringConverter *)&local_d0);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cali::StringConverter>,std::allocator<std::pair<std::__cxx11::string_const,cali::StringConverter>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,cali::StringConverter>>(local_f0,&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>
    ::~pair(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string(local_70);
    p_Var3 = (_Rb_tree_header *)std::__cxx11::string::~string((string *)&local_50);
  }
  return (int)p_Var3;
}

Assistant:

void init(
        const char*                               name,
        const RuntimeConfig::config_entry_list_t& list,
        bool                                      read_env,
        const ::config_profile_t&                 profile,
        const ::config_profile_t&                 top_profile
    )
    {
        for (const auto& e : list) {
            std::string varname { ::config_var_name(name, e.first) };
            std::string value { e.second };

            // See if there is an entry in the top config profile
            auto topit = top_profile.find(varname);

            if (topit != top_profile.end()) {
                value = topit->second;
            } else {
                // See if there is an entry in the base config profile
                auto it = profile.find(varname);
                if (it != profile.end())
                    value = it->second;

                if (read_env) {
                    // See if there is a config variable set
                    char* val = getenv(::config_var_name(name, e.first).c_str());
                    if (val)
                        value = val;
                }
            }

            m_dict.emplace(make_pair(e.first, StringConverter(value)));
        }
    }